

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O1

uint __thiscall TURBOLINECOUNT::CLineCount::countThread(CLineCount *this,int thread_number)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  void *__addr;
  void *pvVar5;
  void *pvVar6;
  size_t __n;
  long lVar7;
  size_t __len;
  void *pvVar8;
  size_t __len_00;
  allocator<char> local_bd;
  uint local_bc;
  void *local_b8;
  string *local_b0;
  long local_a8;
  long local_a0;
  size_t local_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_98 = (this->m_parameters).buffersize;
  local_a8 = (long)thread_number;
  pvVar6 = (void *)(local_98 * local_a8);
  local_a0 = (long)this->m_actual_thread_count * local_98;
  local_b0 = (string *)&this->m_lasterrorstring;
  __addr = (void *)0x0;
  lVar7 = 0;
  __len = 0;
  do {
    __len_00 = this->m_filesize - (long)pvVar6;
    if (__len_00 == 0 || this->m_filesize < (long)pvVar6) {
      if ((__addr != (void *)0x0) && (iVar2 = munmap(__addr,__len), iVar2 != 0)) {
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        pcVar4 = strerror(iVar2);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar4,&local_bd);
        this->m_lasterror = iVar2;
        std::__cxx11::string::_M_assign(local_b0);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        this->m_thread_fail = true;
        return 0xffffffff;
      }
      (this->m_threadlinecounts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start[local_a8] = lVar7;
      return 0;
    }
    local_bc = 0xffffffff;
    if (this->m_thread_fail != false) {
      return 0xffffffff;
    }
    if ((long)local_98 < (long)__len_00) {
      __len_00 = local_98;
    }
    if ((__addr == (void *)0x0) || (iVar2 = munmap(__addr,__len), iVar2 == 0)) {
      local_b8 = pvVar6;
      __addr = mmap64((void *)0x0,__len_00,1,1,this->m_fh,(__off64_t)pvVar6);
      pvVar6 = __addr;
      __n = __len_00;
      if (__addr == (void *)0xffffffffffffffff) {
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        pcVar4 = strerror(iVar2);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_90,pcVar4,&local_bd);
        this->m_lasterror = iVar2;
        std::__cxx11::string::_M_assign(local_b0);
        pvVar6 = local_b8;
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        this->m_thread_fail = true;
        __addr = (void *)0xffffffffffffffff;
        bVar1 = false;
      }
      else {
        while (__n != 0) {
          pvVar5 = memchr(pvVar6,10,__n);
          pvVar8 = (void *)((long)pvVar5 + 1);
          __n = (long)pvVar6 + (__n - (long)pvVar8);
          if (pvVar5 == (void *)0x0) {
            __n = 0;
            pvVar8 = pvVar6;
          }
          lVar7 = lVar7 + (ulong)(pvVar5 != (void *)0x0);
          pvVar6 = pvVar8;
        }
        if (__len_00 + (long)local_b8 == this->m_filesize) {
          lVar7 = lVar7 + (ulong)(*(char *)((long)__addr + (__len_00 - 1)) != '\n');
        }
        pvVar6 = (void *)((long)local_b8 + local_a0);
        bVar1 = true;
        __len = __len_00;
      }
    }
    else {
      local_b8 = __addr;
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      pcVar4 = strerror(iVar2);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar4,&local_bd);
      this->m_lasterror = iVar2;
      std::__cxx11::string::_M_assign(local_b0);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      this->m_thread_fail = true;
      bVar1 = false;
      __addr = local_b8;
    }
  } while (bVar1);
  return local_bc;
}

Assistant:

unsigned int CLineCount::countThread(int thread_number)
{
	tlc_fileoffset_t buffersize = (tlc_fileoffset_t)m_parameters.buffersize;
	tlc_fileoffset_t startoffset = buffersize * (tlc_fileoffset_t)thread_number;
	tlc_fileoffset_t stride = buffersize * m_actual_thread_count;
	tlc_fileoffset_t curoffset = startoffset;
	tlc_fileoffset_t lastmapsize = 0;
	tlc_linecount_t count = 0;
	void *mem = NULL;

	while (curoffset < m_filesize)
	{
		if (m_thread_fail)
		{
			return -1;
		}

		// Get best file mapping window size
		size_t mapsize = (size_t)std::min((m_filesize - curoffset), buffersize);

		// Map view of file
#ifdef _WIN32
		
		if (mem)
		{
			if (!UnmapViewOfFile(mem))
			{
				setLastError(EINVAL, _T("memory unmap failed"));
				m_thread_fail = true;
				return -1;
			}
		}
		mem = MapViewOfFile(m_filemapping, FILE_MAP_READ, (DWORD)(curoffset >> 32), (DWORD)curoffset, (SIZE_T)mapsize);
#else
		if (mem)
		{
			if(munmap(mem, lastmapsize) !=0)
			{
				LCSETREALLASTERROR(EINVAL, _T("memory unmap failed"));
				m_thread_fail = true;
				return -1;
			}
		}
		mem = MMAP(NULL, mapsize, PROT_READ, MAP_FILE | MAP_SHARED, m_fh, curoffset);
//		printf("%p %lld %lld\n",mem, mapsize, curoffset);
#endif		
		if (mem == MAP_FAILED)
		{
			LCSETREALLASTERROR(EINVAL, _T("memory map failed"));
			m_thread_fail = true;
			return -1;
		}

		// Count newlines in buffer
		tlc_fileoffset_t windowoffset = 0;
		size_t windowleft = mapsize;
		char *ptr = (char *)mem;
		while (windowleft > 0)
		{
			char *ptrnext = (char *)memchr(ptr, '\n', windowleft);
			if (ptrnext)
			{
				ptrnext++;
				count++;
				windowleft -= (ptrnext - ptr);
				ptr = ptrnext;
			}
			else
			{
				windowleft = 0;
			}
		}

		// See if we need to account for end of file not ending with line terminator
		if ((curoffset + mapsize) == m_filesize)
		{
			if (*((char *)mem + (mapsize - 1)) != '\n')
			{
				count++;
			}
		}

		// Move to next buffer
		curoffset += stride;
		lastmapsize = mapsize;

//		printf("%lld\n", curoffset);
	}

	// Clean up memory map
#ifdef _WIN32
	if (mem)
	{
		if (!UnmapViewOfFile(mem))
		{
			setLastError(EINVAL, _T("memory unmap failed"));
			m_thread_fail = true;
			return -1;
		}
	}
#else
	if (mem)
	{
		if (munmap(mem, lastmapsize) != 0)
		{
			LCSETREALLASTERROR(EINVAL, _T("memory unmap failed"));
			m_thread_fail = true;
			return -1;
		}
	}
#endif

	// Save count for this thread
	m_threadlinecounts[thread_number] = count;

	return 0;
}